

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlcachedresult.cpp
# Opt level: O2

bool __thiscall QSqlCachedResult::isNull(QSqlCachedResult *this,int i)

{
  QSqlResultPrivate *pQVar1;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  
  pQVar1 = (this->super_QSqlResult).d_ptr;
  if (pQVar1->forwardOnly == true) {
    iVar4 = *(int *)((long)&pQVar1[1].sqldriver.wp.value + 4);
    iVar3 = i;
  }
  else {
    iVar3 = QSqlResult::at(&this->super_QSqlResult);
    iVar4 = *(int *)((long)&pQVar1[1].sqldriver.wp.value + 4);
    iVar3 = iVar3 * iVar4 + i;
  }
  if ((-1 < i) && (i < iVar4)) {
    iVar4 = QSqlResult::at(&this->super_QSqlResult);
    if ((-1 < iVar4) && (iVar3 < *(int *)&pQVar1[1].sqldriver.wp.value)) {
      uVar2 = QVariant::isNull();
      return (bool)uVar2;
    }
  }
  return true;
}

Assistant:

bool QSqlCachedResult::isNull(int i)
{
    Q_D(const QSqlCachedResult);
    int idx = d->forwardOnly ? i : at() * d->colCount + i;
    if (i >= d->colCount || i < 0 || at() < 0 || idx >= d->rowCacheEnd)
        return true;

    return d->cache.at(idx).isNull();
}